

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O2

void __thiscall
CVmObjFrameDesc::restore_from_file
          (CVmObjFrameDesc *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  vm_obj_id_t fref;
  int frame_idx;
  uint ret_ofs;
  ulong uVar1;
  
  uVar1 = CVmFile::read_uint4(fp);
  fref = CVmObjFixup::get_new_id(fixups,(vm_obj_id_t)uVar1);
  frame_idx = CVmFile::read_int2(fp);
  ret_ofs = CVmFile::read_uint2(fp);
  alloc_ext(this,fref,frame_idx,ret_ofs);
  return;
}

Assistant:

void CVmObjFrameDesc::restore_from_file(VMG_ vm_obj_id_t self,
                                        class CVmFile *fp,
                                        class CVmObjFixup *fixups)
{
    /* read the values */
    vm_obj_id_t fref = fixups->get_new_id(vmg_ (vm_obj_id_t)fp->read_uint4());
    int frame_idx = fp->read_int2();
    uint ret_ofs = fp->read_uint2();

    /* allocate the extension */
    alloc_ext(vmg_ fref, frame_idx, ret_ofs);
}